

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs5MatchImpl<false>
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  int iVar1;
  RegexPattern *this;
  TrigramAlphabet *this_00;
  char *pcVar2;
  RecyclableObject *nonMatchValue;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint16 uVar6;
  charcount_t inputLength;
  CharCountOrFlag offset;
  int iVar7;
  char16 *input_00;
  GroupInfo GVar8;
  SparseArraySegmentBase *pSVar9;
  Var ptr;
  undefined4 *puVar10;
  Matcher *pMVar11;
  GroupInfo *pGVar12;
  JavascriptArray *this_01;
  JavascriptString *pJVar13;
  JavascriptLibrary *pJVar14;
  ulong uVar15;
  RegexPattern *pattern;
  RegexPattern *extraout_RDX;
  RegexPattern *extraout_RDX_00;
  int k;
  long lVar16;
  WriteBarrierPtr<Js::JavascriptString> *this_02;
  CharCount inputLength_00;
  ulong uVar17;
  ulong uVar18;
  int k_1;
  charcount_t length;
  uint itemIndex;
  Type *this_03;
  undefined1 auVar19 [16];
  undefined1 local_98 [8];
  RegexMatchState state;
  JavascriptArray *local_40;
  
  this = (regularExpression->pattern).ptr;
  state.matcher = (Matcher *)stackAllocationPointer;
  input_00 = JavascriptString::GetString(input);
  inputLength_00 = (CharCount)stackAllocationPointer;
  inputLength = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,Match,regularExpression,input);
  this_00 = scriptContext->trigramAlphabet;
  pcVar2 = *(char **)((long)&this->rep + 0x10);
  if ((249999 < inputLength && this_00 != (TrigramAlphabet *)0x0) && pcVar2 != (char *)0x0) {
    if (this_00->input == (char16 *)0x0) {
      UnifiedRegex::TrigramAlphabet::MegaMatch(this_00,input_00,inputLength);
    }
    if (*pcVar2 == '\x01') {
      iVar1 = *(int *)(pcVar2 + 0xc);
      if (iVar1 < 1) {
        uVar17 = 0xffffffff00000000;
        local_40 = (JavascriptArray *)0x0;
      }
      else {
        local_40 = (JavascriptArray *)(ulong)*(uint *)(pcVar2 + (ulong)(iVar1 - 1) * 4 + 0x10);
        uVar17 = 0x800000000;
      }
      if ((this->rep).unified.program.ptr == (Program *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1dc,"(pattern->rep.unified.program != 0)",
                                    "pattern->rep.unified.program != 0");
        if (!bVar5) goto LAB_00be247d;
        *puVar10 = 0;
      }
      pMVar11 = (this->rep).unified.matcher.ptr;
      if (pMVar11 == (Matcher *)0x0) {
        pMVar11 = UnifiedRegex::Matcher::New(scriptContext,this);
        Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::WriteBarrierSet
                  (&(this->rep).unified.matcher,pMVar11);
        pMVar11 = (this->rep).unified.matcher.ptr;
      }
      pGVar12 = UnifiedRegex::Matcher::GroupIdToGroupInfo(pMVar11,0);
      *pGVar12 = (GroupInfo)(uVar17 | (ulong)local_40);
      bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1e1,"(pattern->IsGlobal())","pattern->IsGlobal()");
        if (!bVar5) {
LAB_00be247d:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      UnifiedRegex::RegexPattern::NumGroups(this);
      this_01 = JavascriptLibrary::CreateArrayOnStack
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,state.matcher)
      ;
      iVar7 = *(int *)(pcVar2 + 0xc);
      if (0 < iVar7) {
        if (pcVar2[1] == '\0') {
          this_02 = (WriteBarrierPtr<Js::JavascriptString> *)(pcVar2 + 0x90);
          for (lVar16 = 0; lVar16 < iVar7; lVar16 = lVar16 + 1) {
            pJVar13 = SubString::New(input,*(charcount_t *)(pcVar2 + lVar16 * 4 + 0x10),8);
            Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet(this_02,pJVar13);
            JavascriptArray::DirectSetItemAt<Js::JavascriptString*>(this_01,(uint32)lVar16,pJVar13);
            iVar7 = *(int *)(pcVar2 + 0xc);
            this_02 = this_02 + 1;
          }
          pcVar2[1] = '\x01';
        }
        else {
          for (lVar16 = 0; lVar16 < iVar7; lVar16 = lVar16 + 1) {
            JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                      (this_01,(uint32)lVar16,*(JavascriptString **)(pcVar2 + lVar16 * 8 + 0x90));
            iVar7 = *(int *)(pcVar2 + 0xc);
          }
        }
      }
      if (0 < iVar1) {
        return this_01;
      }
      pJVar14 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
      goto LAB_00be245f;
    }
  }
  bVar5 = UnifiedRegex::RegexPattern::IsGlobal(this);
  bVar4 = UnifiedRegex::RegexPattern::IsSticky(this);
  offset = 0;
  if ((!bVar5) && (offset = 0, bVar4)) {
    offset = JavascriptRegExp::GetLastIndex(regularExpression);
  }
  uVar18 = 0;
  PrimBeginMatch((RegexMatchState *)local_98,scriptContext,this,input_00,inputLength_00,false);
  auVar19 = __tls_get_addr(&PTR_013e5f18);
  pattern = auVar19._8_8_;
  puVar10 = auVar19._0_8_;
  itemIndex = 0;
  local_40 = (JavascriptArray *)0x0;
  uVar17 = 0xffffffffffffffff;
  do {
    if (inputLength < offset) break;
    GVar8 = PrimMatch((RegexMatchState *)local_98,scriptContext,this,inputLength,offset);
    uVar15 = (ulong)GVar8 >> 0x20;
    pattern = (RegexPattern *)0xffffffff;
    if (uVar15 == 0xffffffff) break;
    uVar18 = (ulong)GVar8 & 0xffffffff;
    length = GVar8.length;
    if (!noResult) {
      if (local_40 == (JavascriptArray *)0x0) {
        uVar6 = UnifiedRegex::RegexPattern::NumGroups(this);
        local_40 = CreateMatchResult(state.matcher,scriptContext,bVar5,(uint)uVar6,input);
      }
      pJVar13 = SubString::New(input,GVar8.offset,length);
      if (bVar5) {
        JavascriptArray::DirectSetItemAt<Js::JavascriptString*>(local_40,itemIndex,pJVar13);
        pattern = extraout_RDX;
      }
      else {
        pSVar9 = (local_40->head).ptr;
        if (pSVar9->length <= itemIndex) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x22f,"(globalIndex < arrayResult->GetHead()->length)",
                                      "globalIndex < arrayResult->GetHead()->length");
          if (!bVar4) goto LAB_00be247d;
          *puVar10 = 0;
          pSVar9 = (local_40->head).ptr;
        }
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  ((WriteBarrierPtr<void> *)(&pSVar9[1].left + (ulong)itemIndex * 2),pJVar13);
        pattern = extraout_RDX_00;
      }
      itemIndex = itemIndex + 1;
    }
    offset = GVar8.offset + length + (uint)(length == 0);
    uVar17 = uVar15;
  } while (bVar5);
  PrimEndMatch((RegexMatchState *)local_98,scriptContext,pattern);
  if (local_40 != (JavascriptArray *)0x0) {
    uVar6 = UnifiedRegex::RegexPattern::NumGroups(this);
    if (bVar5) {
      return local_40;
    }
    if (1 < uVar6) {
      nonMatchValue =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      this_03 = (Type *)&(local_40->head).ptr[1].size;
      for (uVar15 = 1; uVar6 != uVar15; uVar15 = uVar15 + 1) {
        pSVar9 = (local_40->head).ptr;
        if (pSVar9->length + pSVar9->left <= uVar15) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x24b,
                                      "(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length)"
                                      ,
                                      "groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length"
                                     );
          if (!bVar5) goto LAB_00be247d;
          *puVar10 = 0;
        }
        ptr = GetGroup(scriptContext,this,input,nonMatchValue,(int)uVar15);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet((WriteBarrierPtr<void> *)this_03,ptr);
        this_03 = this_03 + 1;
      }
    }
    JavascriptRegularExpressionResult::SetMatch(local_40,(GroupInfo)(uVar18 | uVar17 << 0x20));
    return local_40;
  }
  pJVar14 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
LAB_00be245f:
  return (pJVar14->super_JavascriptLibraryBase).nullValue.ptr;
}

Assistant:

Var RegexHelper::RegexEs5MatchImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Match, regularExpression, input);
#endif

        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined
        UnifiedRegex::GroupInfo lastActualMatch; // initially undefined

#ifdef REGEX_TRIGRAMS
        UnifiedRegex::TrigramAlphabet* trigramAlphabet = scriptContext->GetTrigramAlphabet();
        UnifiedRegex::TrigramInfo* trigramInfo = pattern->rep.unified.trigramInfo;
        if (trigramAlphabet != NULL && inputLength >= MinTrigramInputLength && trigramInfo != NULL)
        {
            if (trigramAlphabet->input == NULL)
            {
                trigramAlphabet->MegaMatch((char16*)inputStr, inputLength);
            }
            if (trigramInfo->isTrigramPattern)
            {
                if (trigramInfo->resultCount > 0)
                {
                    lastSuccessfulMatch.offset = trigramInfo->offsets[trigramInfo->resultCount - 1];
                    lastSuccessfulMatch.length = UnifiedRegex::TrigramInfo::PatternLength;
                }
                // else: leave lastMatch undefined

                // Make sure a matcher is allocated and holds valid last match in case the RegExp constructor
                // needs to fill-in details from the last match via JavascriptRegExpConstructor::EnsureValues
                Assert(pattern->rep.unified.program != 0);
                if (pattern->rep.unified.matcher == 0)
                    pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
                *pattern->rep.unified.matcher->GroupIdToGroupInfo(0) = lastSuccessfulMatch;

                Assert(pattern->IsGlobal());

                JavascriptArray* arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, /* isGlobal */ true, pattern->NumGroups(), input);
                FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);

                if (trigramInfo->resultCount > 0)
                {
                    if (trigramInfo->hasCachedResultString)
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            arrayResult->DirectSetItemAt(k,
                                static_cast<Js::JavascriptString*>(trigramInfo->cachedResult[k]));
                        }
                    }
                    else
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            JavascriptString * str = SubString::New(input, trigramInfo->offsets[k], UnifiedRegex::TrigramInfo::PatternLength);
                            trigramInfo->cachedResult[k] = str;
                            arrayResult->DirectSetItemAt(k, str);
                        }
                        trigramInfo->hasCachedResultString = true;
                    }
                } // otherwise, there are no results and null will be returned

                if (updateHistory)
                {
                    PropagateLastMatch(scriptContext, /* isGlobal */ true, pattern->IsSticky(), regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
                }

                return lastSuccessfulMatch.IsUndefined() ? scriptContext->GetLibrary()->GetNull() : arrayResult;
            }
        }
#endif

        // If global regex, result array holds substrings for each match, and group bindings are ignored
        // If non-global regex, result array holds overall substring and each group binding substring

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        JavascriptArray* arrayResult = 0;
        RegexMatchState state;

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        uint32 globalIndex = 0;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }
            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;
            lastSuccessfulMatch = lastActualMatch;
            if (!noResult)
            {
                if (arrayResult == 0)
                    arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, isGlobal, pattern->NumGroups(), input);
                JavascriptString *const matchedString = SubString::New(input, lastActualMatch.offset, lastActualMatch.length);
                if (isGlobal)
                    arrayResult->DirectSetItemAt(globalIndex, matchedString);
                else
                {
                    // The array's head segment up to length - 1 may not be filled. Write to the head segment element directly
                    // instead of calling a helper that expects the segment to be pre-filled.
                    Assert(globalIndex < arrayResult->GetHead()->length);
                    static_cast<SparseArraySegment<Var> *>(arrayResult->GetHead())->elements[globalIndex] = matchedString;
                }
                globalIndex++;
            }
            offset = lastActualMatch.offset + max(lastActualMatch.length, static_cast<CharCountOrFlag>(1));
        } while (isGlobal);
        PrimEndMatch(state, scriptContext, pattern);
        if (updateHistory)
        {
            PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        }

        if (arrayResult == 0)
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        if (!isGlobal)
        {
            if (numGroups > 1)
            {
                // Overall match already captured in index 0 by above, so just grab the groups
                Var nonMatchValue = NonMatchValue(scriptContext, false);
                Field(Var) *elements = ((SparseArraySegment<Var>*)arrayResult->GetHead())->elements;
                for (uint groupId = 1; groupId < (uint)numGroups; groupId++)
                {
                    Assert(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length);
                    elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
                }
            }
            FinalizeMatchResult(scriptContext, /* isGlobal */ false, arrayResult, lastSuccessfulMatch);
        }
        else
        {
            FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);
        }

        return arrayResult;
    }